

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseRAPass::assignRAInst
          (BaseRAPass *this,BaseNode *node,RABlock *block,RAInstBuilder *ib)

{
  RAInstBuilder *pRVar1;
  Array<unsigned_char,_4UL> *pAVar2;
  undefined8 *puVar3;
  uint *puVar4;
  RAInstBuilder RVar5;
  byte bVar6;
  uint uVar7;
  long *plVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Error EVar13;
  BaseRAPass *pBVar14;
  uint uVar15;
  long lVar16;
  undefined8 *extraout_RDX;
  ulong uVar17;
  long lVar18;
  undefined1 *size;
  ulong uVar19;
  ZoneAllocator *allocator;
  uint uVar20;
  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *pRVar21;
  RAInstBuilder *pRVar22;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dd;
  RARegIndex index;
  uint32_t uStack_8c;
  RAInstBuilder *pRStack_88;
  BaseRAPass *pBStack_80;
  RAInstBuilder *pRStack_78;
  BaseNode *pBStack_70;
  RABlock *pRStack_68;
  ulong uStack_60;
  uint local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this_00;
  
  pRVar1 = ib + 0x40;
  uVar17 = *(long *)(ib + 0x38) - (long)pRVar1;
  uVar23 = (undefined4)*(undefined8 *)(ib + 4);
  uVar24 = (undefined4)((ulong)*(undefined8 *)(ib + 4) >> 0x20);
  uVar25 = 0;
  uVar26 = 0;
  this_00 = *(RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> **)&this->_allocator;
  size = (undefined1 *)((uVar17 & 0x1fffffffe0) + 0x50);
  pBVar14 = this_00->_pass;
  if ((undefined1 *)((long)this_00->_cc - (long)pBVar14) < size) goto LAB_0013852f;
  this_00->_pass = (BaseRAPass *)(size + (long)pBVar14);
  while( true ) {
    if (pBVar14 == (BaseRAPass *)0x0) {
      return 1;
    }
    uVar17 = uVar17 >> 5;
    (pBVar14->super_FuncPass).super_Pass._vptr_Pass = (_func_int **)block;
    (pBVar14->super_FuncPass).super_Pass._cb = (BaseBuilder *)CONCAT44(uVar24,uVar23);
    *(int *)&(pBVar14->super_FuncPass).super_Pass._name = (int)uVar17;
    *(undefined8 *)((long)&(pBVar14->super_FuncPass).super_Pass._name + 4) = 0;
    *(undefined8 *)&pBVar14->field_0x1c = 0;
    *(undefined8 *)&pBVar14->field_0x24 = 0;
    *(undefined8 *)&pBVar14->field_0x2c = 0;
    *(undefined8 *)&pBVar14->field_0x34 = 0;
    uVar10 = *(undefined8 *)(ib + 0x30);
    *(undefined8 *)&pBVar14->field_0x3c = *(undefined8 *)(ib + 0x28);
    *(undefined8 *)&pBVar14->field_0x44 = uVar10;
    RVar5 = ib[0x10];
    uVar19 = (ulong)(byte)RVar5;
    uVar15 = (uint)(byte)ib[0x11] + (uint)(byte)RVar5;
    if (0xff < uVar15) break;
    uVar20 = (byte)ib[0x12] + uVar15;
    this_00 = (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)(ulong)uVar20;
    if (0xff < uVar20) goto LAB_00138554;
    uVar7 = *(uint *)(ib + 0xc);
    local_4c = uVar20 * 0x1000000 | uVar15 * 0x10000 | (uint)(byte)RVar5 << 8;
    *(uint *)((long)&(pBVar14->super_FuncPass).super_Pass._name + 4) = local_4c;
    *(undefined4 *)&pBVar14->_allocator = *(undefined4 *)(ib + 0x10);
    if ((int)uVar17 == 0) {
LAB_00138506:
      *(BaseRAPass **)(node + 0x20) = pBVar14;
      return 0;
    }
    size = &pBVar14->field_0x4c;
    this_00 = (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)(uVar17 & 0xffffffff);
    pRVar22 = ib + 0x4f;
    pRVar21 = (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)0x0;
    while (pRVar21 < (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)
                     ((ulong)(*(long *)(ib + 0x38) - (long)pRVar1) >> 5 & 0xffffffff)) {
      if (*(uint *)&this->field_0x148 <= *(uint *)(pRVar22 + -0xf)) goto LAB_00138520;
      lVar16 = *(long *)(*(long *)&this->_workRegs + (ulong)*(uint *)(pRVar22 + -0xf) * 8);
      *(undefined8 *)(lVar16 + 0x10) = 0;
      uVar15 = *(byte *)(lVar16 + 0x21) & 0xf;
      uVar19 = (ulong)uVar15;
      if (pRVar22[-1] != (RAInstBuilder)0xff) {
        block[0xd] = (RABlock)((byte)block[0xd] | 8);
        if (3 < (byte)uVar15) goto LAB_0013852a;
        pAVar2 = &(pBVar14->_formatOptions)._indentation + ((ulong)uVar15 - 0x18);
        *(uint *)pAVar2->_data = *(uint *)pAVar2->_data | 1 << ((byte)pRVar22[-1] & 0x1f);
      }
      if (*pRVar22 != (RAInstBuilder)0xff) {
        block[0xd] = (RABlock)((byte)block[0xd] | 8);
      }
      if (3 < (byte)uVar15) goto LAB_00138525;
      bVar6 = *(byte *)((long)&local_4c + uVar19);
      uVar15 = bVar6 + 1;
      uVar17 = (ulong)uVar15;
      *(char *)((long)&local_4c + uVar19) = (char)uVar15;
      lVar16 = (ulong)bVar6 * 0x20;
      uVar10 = *(undefined8 *)(pRVar22 + -7);
      uVar11 = *(undefined8 *)(pRVar22 + 1);
      uVar12 = *(undefined8 *)(pRVar22 + 9);
      *(undefined8 *)(size + lVar16) = *(undefined8 *)(pRVar22 + -0xf);
      *(undefined8 *)((long)(size + lVar16) + 8) = uVar10;
      puVar3 = (undefined8 *)((long)&pBVar14->_formatOptions + lVar16 + -0x2c);
      *puVar3 = uVar11;
      puVar3[1] = uVar12;
      puVar4 = (uint *)((long)&pBVar14->_formatOptions + lVar16 + -0x34);
      *puVar4 = *puVar4 & ~uVar7;
      if (((byte)pRVar22[-5] & 1) == 0) {
        *(uint *)(size + lVar16 + 0x10) =
             *(uint *)(size + lVar16 + 0x10) & ~*(uint *)(ib + uVar19 * 4 + 0x18);
      }
      pRVar21 = (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)((long)&pRVar21->_pass + 1);
      pRVar22 = pRVar22 + 0x20;
      if (this_00 == pRVar21) goto LAB_00138506;
    }
    uStack_60 = 0x138520;
    assignRAInst();
LAB_00138520:
    uStack_60 = 0x138525;
    assignRAInst();
LAB_00138525:
    uStack_60 = 0x13852a;
    assignRAInst();
LAB_0013852a:
    uStack_60 = 0x13852f;
    assignRAInst();
    uVar23 = extraout_XMM0_Da;
    uVar24 = extraout_XMM0_Db;
    uVar25 = extraout_XMM0_Dc;
    uVar26 = extraout_XMM0_Dd;
LAB_0013852f:
    uStack_60 = 0x13853e;
    local_48 = uVar23;
    uStack_44 = uVar24;
    uStack_40 = uVar25;
    uStack_3c = uVar26;
    pBVar14 = (BaseRAPass *)Zone::_alloc((Zone *)this_00,(size_t)size,1);
    uVar23 = local_48;
    uVar24 = uStack_44;
  }
  uStack_60 = 0x138554;
  assignRAInst();
LAB_00138554:
  uStack_60 = 0x138559;
  assignRAInst();
  uVar15 = *(uint *)(uVar19 + 0x70);
  if ((ulong)uVar15 < 2) {
    return 0;
  }
  plVar8 = *(long **)(uVar19 + 0x68);
  if ((*(byte *)(uVar19 + 0xd) & 2) == 0) {
    lVar16 = 0;
  }
  else {
    lVar16 = *plVar8;
  }
  uStack_8c = 0xffffffff;
  lVar18 = 0;
  pRVar21 = this_00;
  pRStack_88 = ib;
  pBStack_80 = this;
  pRStack_78 = pRVar1;
  pBStack_70 = node;
  pRStack_68 = block;
  uStack_60 = uVar17;
  do {
    allocator = (ZoneAllocator *)0xffffffff;
    lVar9 = *(long *)((long)plVar8 + lVar18);
    uVar20 = uStack_8c;
    if (lVar9 != lVar16) {
      uVar20 = *(uint *)(lVar9 + 0xb8);
      if ((ulong)uVar20 == 0xffffffff) {
        if ((uStack_8c == 0xffffffff) &&
           (pRVar21 = this_00,
           EVar13 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::newSharedAssignmentId
                              (this_00,&uStack_8c), EVar13 != 0)) {
          return EVar13;
        }
        *(uint32_t *)(lVar9 + 0xb8) = uStack_8c;
        uVar20 = uStack_8c;
      }
      else if (uStack_8c != 0xffffffff) {
        if (*(uint *)&this_00->field_0x38 <= uVar20) {
          RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::shareAssignmentAcrossSuccessors();
          uVar15 = *(uint *)&pRVar21->_cc;
          if (uVar15 == *(uint *)((long)&pRVar21->_cc + 4)) {
            EVar13 = ZoneVectorBase::_grow((ZoneVectorBase *)pRVar21,allocator,8,1);
            if (EVar13 != 0) {
              return EVar13;
            }
            uVar15 = *(uint *)&pRVar21->_cc;
          }
          (&(pRVar21->_pass->super_FuncPass).super_Pass._vptr_Pass)[uVar15] =
               (_func_int **)*extraout_RDX;
          *(int *)&pRVar21->_cc = *(int *)&pRVar21->_cc + 1;
          return 0;
        }
        *(uint32_t *)(*(long *)&this_00->_sharedAssignmentsMap + (ulong)uVar20 * 4) = uStack_8c;
        uVar20 = uStack_8c;
      }
    }
    uStack_8c = uVar20;
    lVar18 = lVar18 + 8;
    if ((ulong)uVar15 << 3 == lVar18) {
      return 0;
    }
  } while( true );
}

Assistant:

ASMJIT_FORCE_INLINE Error assignRAInst(BaseNode* node, RABlock* block, RAInstBuilder& ib) noexcept {
    uint32_t tiedRegCount = ib.tiedRegCount();
    RAInst* raInst = newRAInst(block, ib.instRWFlags(), ib.aggregatedFlags(), tiedRegCount, ib._clobbered);

    if (ASMJIT_UNLIKELY(!raInst))
      return DebugUtils::errored(kErrorOutOfMemory);

    RARegIndex index;
    RATiedFlags flagsFilter = ~ib.forbiddenFlags();

    index.buildIndexes(ib._count);
    raInst->_tiedIndex = index;
    raInst->_tiedCount = ib._count;

    for (uint32_t i = 0; i < tiedRegCount; i++) {
      RATiedReg* tiedReg = ib[i];
      RAWorkReg* workReg = workRegById(tiedReg->workId());

      workReg->resetTiedReg();
      RegGroup group = workReg->group();

      if (tiedReg->hasUseId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
        raInst->_usedRegs[group] |= Support::bitMask(tiedReg->useId());
      }

      if (tiedReg->hasOutId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
      }

      RATiedReg& dst = raInst->_tiedRegs[index[group]++];
      dst = *tiedReg;
      dst._flags &= flagsFilter;

      if (!tiedReg->isDuplicate())
        dst._useRegMask &= ~ib._used[group];
    }

    node->setPassData<RAInst>(raInst);
    return kErrorOk;
  }